

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::ServiceDescriptor::CopyTo(ServiceDescriptor *this,ServiceDescriptorProto *proto)

{
  int iVar1;
  string *value;
  MethodDescriptor *this_00;
  MethodDescriptorProto *proto_00;
  ServiceOptions *pSVar2;
  ServiceOptions *pSVar3;
  undefined4 local_1c;
  int i;
  ServiceDescriptorProto *proto_local;
  ServiceDescriptor *this_local;
  
  value = name_abi_cxx11_(this);
  ServiceDescriptorProto::set_name(proto,value);
  local_1c = 0;
  while( true ) {
    iVar1 = method_count(this);
    if (iVar1 <= local_1c) break;
    this_00 = method(this,local_1c);
    proto_00 = ServiceDescriptorProto::add_method(proto);
    MethodDescriptor::CopyTo(this_00,proto_00);
    local_1c = local_1c + 1;
  }
  pSVar2 = options(this);
  pSVar3 = ServiceOptions::default_instance();
  if (pSVar2 != pSVar3) {
    pSVar2 = ServiceDescriptorProto::mutable_options(proto);
    pSVar3 = options(this);
    ServiceOptions::CopyFrom(pSVar2,pSVar3);
  }
  return;
}

Assistant:

void ServiceDescriptor::CopyTo(ServiceDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < method_count(); i++) {
    method(i)->CopyTo(proto->add_method());
  }

  if (&options() != &ServiceOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}